

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void __thiscall QSslSocket::setLocalCertificate(QSslSocket *this,QSslCertificate *certificate)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_68;
  QArrayDataPointer<QSslCertificate> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (QSslCertificate *)0x0;
  local_48.d = *(Data **)(lVar1 + 0x2c0);
  local_48.ptr = *(QSslCertificate **)(lVar1 + 0x2c8);
  *(undefined8 *)(lVar1 + 0x2c0) = 0;
  *(undefined8 *)(lVar1 + 0x2c8) = 0;
  local_48.size = *(qsizetype *)(lVar1 + 0x2d0);
  *(undefined8 *)(lVar1 + 0x2d0) = 0;
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_68);
  QtPrivate::QMovableArrayOps<QSslCertificate>::emplace<QSslCertificate_const&>
            ((QMovableArrayOps<QSslCertificate> *)(lVar1 + 0x2c0),*(qsizetype *)(lVar1 + 0x2d0),
             certificate);
  QList<QSslCertificate>::end((QList<QSslCertificate> *)(lVar1 + 0x2c0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setLocalCertificate(const QSslCertificate &certificate)
{
    Q_D(QSslSocket);
    d->configuration.localCertificateChain = QList<QSslCertificate>();
    d->configuration.localCertificateChain += certificate;
}